

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprNodeIsConstantFunction(Walker *pWalker,Expr *pExpr)

{
  FuncDef *pFVar1;
  long in_RSI;
  long in_RDI;
  sqlite3 *db;
  FuncDef *pDef;
  ExprList *pList;
  int n;
  u8 in_stack_fffffffffffffffa;
  u8 in_stack_fffffffffffffffb;
  int in_stack_fffffffffffffffc;
  int iVar2;
  
  if ((((*(uint *)(in_RSI + 4) & 0x10000) == 0) && (*(Walker **)(in_RSI + 0x20) != (Walker *)0x0))
     && (sqlite3WalkExprList(*(Walker **)(in_RSI + 0x20),(ExprList *)&DAT_aaaaaaaaaaaaaaaa),
        *(short *)(in_RDI + 0x24) == 0)) {
    iVar2 = 2;
  }
  else {
    pFVar1 = sqlite3FindFunction((sqlite3 *)pDef,(char *)db,in_stack_fffffffffffffffc,
                                 in_stack_fffffffffffffffb,in_stack_fffffffffffffffa);
    if (((pFVar1 == (FuncDef *)0x0) || (pFVar1->xFinalize != (_func_void_sqlite3_context_ptr *)0x0))
       || (((pFVar1->funcFlags & 0x2800) == 0 || ((*(uint *)(in_RSI + 4) & 0x1000000) != 0)))) {
      *(undefined2 *)(in_RDI + 0x24) = 0;
      iVar2 = 2;
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static SQLITE_NOINLINE int exprNodeIsConstantFunction(
  Walker *pWalker,
  Expr *pExpr
){
  int n;             /* Number of arguments */
  ExprList *pList;   /* List of arguments */
  FuncDef *pDef;     /* The function */
  sqlite3 *db;       /* The database */

  assert( pExpr->op==TK_FUNCTION );
  if( ExprHasProperty(pExpr, EP_TokenOnly)
   || (pList = pExpr->x.pList)==0
  ){;
    n = 0;
  }else{
    n = pList->nExpr;
    sqlite3WalkExprList(pWalker, pList);
    if( pWalker->eCode==0 ) return WRC_Abort;
  }
  db = pWalker->pParse->db;
  pDef = sqlite3FindFunction(db, pExpr->u.zToken, n, ENC(db), 0);
  if( pDef==0
   || pDef->xFinalize!=0
   || (pDef->funcFlags & (SQLITE_FUNC_CONSTANT|SQLITE_FUNC_SLOCHNG))==0
   || ExprHasProperty(pExpr, EP_WinFunc)
  ){
    pWalker->eCode = 0;
    return WRC_Abort;
  }
  return WRC_Prune;
}